

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  Bit *pBVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar23;
  char **ppcVar24;
  idx_t iVar25;
  ulong uVar26;
  ulong uVar27;
  string_t sVar28;
  string_t sVar29;
  string_t sVar30;
  string_t sVar31;
  string_t sVar32;
  string_t sVar33;
  char **local_68;
  ValidityMask *pVVar22;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pBVar6 = *(Bit **)&ldata->value;
      local_68 = &(rdata->value).pointer.ptr;
      iVar25 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_68 + -1);
        uVar4 = paVar1->length;
        uVar9 = paVar1->prefix[0];
        uVar12 = paVar1->prefix[1];
        uVar15 = paVar1->prefix[2];
        uVar18 = paVar1->prefix[3];
        sVar33.value.inlined.inlined[0xb] = uVar18;
        sVar33.value.inlined.inlined[10] = uVar15;
        sVar33.value.inlined.inlined[9] = uVar12;
        sVar33.value.inlined.inlined[8] = uVar9;
        sVar33.value._8_4_ = uVar4;
        iVar19 = 0;
        if ((uint)pBVar6 <= (uint)uVar4) {
          sVar30.value.pointer.ptr = (char *)mask;
          sVar30.value._0_8_ = *local_68;
          sVar33.value._0_8_ = (ldata->value).pointer.ptr;
          iVar19 = duckdb::Bit::BitPosition(pBVar6,sVar33,sVar30);
        }
        result_data[iVar25] = iVar19;
        iVar25 = iVar25 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar25);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar20 = 0;
    pVVar22 = mask;
    uVar26 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar21 = 0xffffffffffffffff;
      }
      else {
        uVar21 = puVar5[uVar20];
      }
      uVar23 = uVar26 + 0x40;
      if (count <= uVar26 + 0x40) {
        uVar23 = count;
      }
      uVar27 = uVar23;
      if (uVar21 != 0) {
        uVar27 = uVar26;
        if (uVar21 == 0xffffffffffffffff) {
          if (uVar26 < uVar23) {
            pBVar6 = *(Bit **)&ldata->value;
            ppcVar24 = &rdata[uVar26].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar24 + -1);
              uVar2 = paVar1->length;
              uVar7 = paVar1->prefix[0];
              uVar10 = paVar1->prefix[1];
              uVar13 = paVar1->prefix[2];
              uVar16 = paVar1->prefix[3];
              sVar31.value.inlined.inlined[0xb] = uVar16;
              sVar31.value.inlined.inlined[10] = uVar13;
              sVar31.value.inlined.inlined[9] = uVar10;
              sVar31.value.inlined.inlined[8] = uVar7;
              sVar31.value._8_4_ = uVar2;
              iVar19 = 0;
              if ((uint)pBVar6 <= (uint)uVar2) {
                sVar28.value.pointer.ptr = (char *)pVVar22;
                sVar28.value._0_8_ = *ppcVar24;
                sVar31.value._0_8_ = (ldata->value).pointer.ptr;
                iVar19 = duckdb::Bit::BitPosition(pBVar6,sVar31,sVar28);
              }
              result_data[uVar27] = iVar19;
              uVar27 = uVar27 + 1;
              ppcVar24 = ppcVar24 + 2;
            } while (uVar23 != uVar27);
          }
        }
        else if (uVar26 < uVar23) {
          ppcVar24 = &rdata[uVar26].value.pointer.ptr;
          uVar27 = 0;
          do {
            if ((uVar21 >> (uVar27 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar24 + -1);
              uVar3 = paVar1->length;
              uVar8 = paVar1->prefix[0];
              uVar11 = paVar1->prefix[1];
              uVar14 = paVar1->prefix[2];
              uVar17 = paVar1->prefix[3];
              sVar32.value.inlined.inlined[0xb] = uVar17;
              sVar32.value.inlined.inlined[10] = uVar14;
              sVar32.value.inlined.inlined[9] = uVar11;
              sVar32.value.inlined.inlined[8] = uVar8;
              sVar32.value._8_4_ = uVar3;
              iVar19 = 0;
              if ((uint)*(Bit **)&ldata->value <= (uint)uVar3) {
                sVar29.value.pointer.ptr = (char *)pVVar22;
                sVar29.value._0_8_ = *ppcVar24;
                sVar32.value._0_8_ = (ldata->value).pointer.ptr;
                iVar19 = duckdb::Bit::BitPosition(*(Bit **)&ldata->value,sVar32,sVar29);
              }
              result_data[uVar26 + uVar27] = iVar19;
            }
            uVar27 = uVar27 + 1;
            ppcVar24 = ppcVar24 + 2;
          } while ((uVar26 - uVar23) + uVar27 != 0);
          uVar27 = uVar26 + uVar27;
        }
      }
      uVar20 = uVar20 + 1;
      uVar26 = uVar27;
    } while (uVar20 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}